

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_concat(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  int64_t *piVar3;
  ulong uVar4;
  JSValue op1;
  JSValue op2;
  
  op1 = JS_ToStringCheckObject(ctx,this_val);
  if ((int)op1.tag != 6 && 0 < argc) {
    piVar3 = &argv->tag;
    uVar4 = 1;
    do {
      JVar1 = (JSValueUnion)((JSValueUnion *)(piVar3 + -1))->ptr;
      iVar2 = *piVar3;
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
      op2.tag = iVar2;
      op2.u.ptr = JVar1.ptr;
      op1 = JS_ConcatString(ctx,op1,op2);
      if ((uint)argc <= uVar4) {
        return op1;
      }
      piVar3 = piVar3 + 2;
      uVar4 = uVar4 + 1;
    } while ((int)op1.tag != 6);
  }
  return op1;
}

Assistant:

static JSValue js_string_concat(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue r;
    int i;

    /* XXX: Use more efficient method */
    /* XXX: This method is OK if r has a single refcount */
    /* XXX: should use string_buffer? */
    r = JS_ToStringCheckObject(ctx, this_val);
    for (i = 0; i < argc; i++) {
        if (JS_IsException(r))
            break;
        r = JS_ConcatString(ctx, r, JS_DupValue(ctx, argv[i]));
    }
    return r;
}